

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

int yang_read_message(lys_module *module,lys_restr *save,char *value,char *what,int message)

{
  int iVar1;
  char *what_00;
  
  what_00 = "error_message";
  if (message == 0x120) {
    what_00 = "error_app_tag";
  }
  iVar1 = yang_check_string(module,&save->eapptag + (message != 0x120),what_00,what,value,
                            (lys_node *)0x0);
  return iVar1;
}

Assistant:

int
yang_read_message(struct lys_module *module,struct lys_restr *save,char *value, char *what, int message)
{
    int ret;

    if (message == ERROR_APP_TAG_KEYWORD) {
        ret = yang_check_string(module, &save->eapptag, "error_app_tag", what, value, NULL);
    } else {
        ret = yang_check_string(module, &save->emsg, "error_message", what, value, NULL);
    }
    return ret;
}